

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O0

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t *ms,void *end,ZSTD_dictTableLoadMethod_e dtlm)

{
  U32 h;
  uint uVar1;
  U32 h_00;
  U32 *pUVar2;
  U32 *pUVar3;
  BYTE *pBVar4;
  U32 UVar5;
  size_t sVar6;
  BYTE *p;
  size_t lgHash;
  size_t smHash;
  U32 i;
  U32 curr;
  U32 fastHashFillStep;
  BYTE *iend;
  BYTE *ip;
  BYTE *base;
  U32 hBitsS;
  U32 *hashSmall;
  U32 mls;
  U32 hBitsL;
  U32 *hashLarge;
  ZSTD_compressionParameters *cParams;
  ZSTD_dictTableLoadMethod_e dtlm_local;
  void *end_local;
  ZSTD_matchState_t *ms_local;
  size_t local_10;
  
  pUVar2 = ms->hashTable;
  h = (ms->cParams).hashLog;
  uVar1 = (ms->cParams).minMatch;
  pUVar3 = ms->chainTable;
  h_00 = (ms->cParams).chainLog;
  pBVar4 = (ms->window).base;
  iend = pBVar4 + ms->nextToUpdate;
  do {
    if ((BYTE *)((long)end - 8U) < iend + 2) {
      return;
    }
    UVar5 = (int)iend - (int)pBVar4;
    for (smHash._4_4_ = 0; smHash._4_4_ < 3; smHash._4_4_ = smHash._4_4_ + 1) {
      p = iend + smHash._4_4_;
      switch(uVar1) {
      default:
        local_10 = ZSTD_hash4Ptr(p,h_00);
        break;
      case 5:
        local_10 = ZSTD_hash5Ptr(p,h_00);
        break;
      case 6:
        local_10 = ZSTD_hash6Ptr(p,h_00);
        break;
      case 7:
        local_10 = ZSTD_hash7Ptr(p,h_00);
        break;
      case 8:
        local_10 = ZSTD_hash8Ptr(p,h_00);
      }
      sVar6 = ZSTD_hash8Ptr(iend + smHash._4_4_,h);
      if (smHash._4_4_ == 0) {
        pUVar3[local_10] = UVar5;
LAB_00adbfea:
        pUVar2[sVar6] = UVar5 + smHash._4_4_;
      }
      else if (pUVar2[sVar6] == 0) goto LAB_00adbfea;
      if (dtlm == ZSTD_dtlm_fast) break;
    }
    iend = iend + 3;
  } while( true );
}

Assistant:

void ZSTD_fillDoubleHashTable(ZSTD_matchState_t* ms,
                              void const* end, ZSTD_dictTableLoadMethod_e dtlm)
{
    const ZSTD_compressionParameters* const cParams = &ms->cParams;
    U32* const hashLarge = ms->hashTable;
    U32  const hBitsL = cParams->hashLog;
    U32  const mls = cParams->minMatch;
    U32* const hashSmall = ms->chainTable;
    U32  const hBitsS = cParams->chainLog;
    const BYTE* const base = ms->window.base;
    const BYTE* ip = base + ms->nextToUpdate;
    const BYTE* const iend = ((const BYTE*)end) - HASH_READ_SIZE;
    const U32 fastHashFillStep = 3;

    /* Always insert every fastHashFillStep position into the hash tables.
     * Insert the other positions into the large hash table if their entry
     * is empty.
     */
    for (; ip + fastHashFillStep - 1 <= iend; ip += fastHashFillStep) {
        U32 const curr = (U32)(ip - base);
        U32 i;
        for (i = 0; i < fastHashFillStep; ++i) {
            size_t const smHash = ZSTD_hashPtr(ip + i, hBitsS, mls);
            size_t const lgHash = ZSTD_hashPtr(ip + i, hBitsL, 8);
            if (i == 0)
                hashSmall[smHash] = curr + i;
            if (i == 0 || hashLarge[lgHash] == 0)
                hashLarge[lgHash] = curr + i;
            /* Only load extra positions for ZSTD_dtlm_full */
            if (dtlm == ZSTD_dtlm_fast)
                break;
    }   }
}